

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int lua_getmetatable(lua_State *L,int objindex)

{
  int iVar1;
  TValue *pTVar2;
  TValue *i_o;
  TValue *pTVar3;
  Table **ppTVar4;
  
  pTVar2 = L->top;
  pTVar3 = &luaO_nilobject_;
  if (L->base < pTVar2) {
    pTVar3 = L->base;
  }
  iVar1 = pTVar3->tt;
  if (((long)iVar1 == 7) || (iVar1 == 5)) {
    ppTVar4 = &(((pTVar3->value).gc)->h).metatable;
  }
  else {
    ppTVar4 = L->l_G->mt + iVar1;
  }
  if ((GCObject *)*ppTVar4 != (GCObject *)0x0) {
    (pTVar2->value).gc = (GCObject *)*ppTVar4;
    pTVar2->tt = 5;
    L->top = L->top + 1;
    return 1;
  }
  return 0;
}

Assistant:

static int lua_getmetatable(lua_State*L,int objindex){
const TValue*obj;
Table*mt=NULL;
int res;
obj=index2adr(L,objindex);
switch(ttype(obj)){
case 5:
mt=hvalue(obj)->metatable;
break;
case 7:
mt=uvalue(obj)->metatable;
break;
default:
mt=G(L)->mt[ttype(obj)];
break;
}
if(mt==NULL)
res=0;
else{
sethvalue(L,L->top,mt);
api_incr_top(L);
res=1;
}
return res;
}